

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.h
# Opt level: O1

void __thiscall
dynamicgraph::SignalPtr<double,_int>::setFunction
          (SignalPtr<double,_int> *this,function2<double_&,_double_&,_int> *t,Mutex *m)

{
  _func_int *p_Var1;
  vtable_base *pvVar2;
  function_buffer *pfVar3;
  function2<double_&,_double_&,_int> local_38;
  
  (*this->_vptr_SignalPtr[2])
            (this,(_func_int *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
  p_Var1 = this->_vptr_SignalPtr[-3];
  local_38.super_function_base.vtable = (vtable_base *)0x0;
  pvVar2 = (t->super_function_base).vtable;
  if (pvVar2 != (vtable_base *)0x0) {
    pfVar3 = &(t->super_function_base).functor;
    local_38.super_function_base.vtable = pvVar2;
    if (((ulong)pvVar2 & 1) == 0) {
      (*pvVar2->manager)(pfVar3,&local_38.super_function_base.functor,clone_functor_tag);
    }
    else {
      local_38.super_function_base.functor._16_8_ =
           *(undefined8 *)((long)&(t->super_function_base).functor + 0x10);
      local_38.super_function_base.functor.members._0_8_ = (undefined8)*(undefined8 *)pfVar3;
      local_38.super_function_base.functor._8_8_ =
           *(undefined8 *)((long)&(t->super_function_base).functor + 8);
    }
  }
  *(undefined4 *)(&this->field_0x30 + (long)p_Var1) = 3;
  boost::function2<double_&,_double_&,_int>::operator=
            ((function2<double_&,_double_&,_int> *)(&this->field_0x68 + (long)p_Var1),&local_38);
  *(Mutex **)(&this->field_0x90 + (long)p_Var1) = m;
  (&this->field_0x50)[(long)p_Var1] = 0;
  (&this->field_0x2c)[(long)p_Var1] = 1;
  boost::function2<double_&,_double_&,_int>::~function2(&local_38);
  return;
}

Assistant:

virtual void setFunction(boost::function2<T &, T &, Time> t,
                           typename Signal<T, Time>::Mutex *m = NULL) {
    plug(this);
    Signal<T, Time>::setFunction(t, m);
  }